

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::MethodPrototypeSymbol::MethodPrototypeSymbol
          (MethodPrototypeSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          SubroutineKind subroutineKind,Visibility visibility,bitmask<slang::ast::MethodFlags> flags
          )

{
  (this->super_Symbol).kind = MethodPrototype;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  DeclaredType::DeclaredType
            (&this->declaredReturnType,&this->super_Symbol,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this->subroutineKind = subroutineKind;
  this->visibility = visibility;
  (this->flags).m_bits = flags.m_bits;
  (this->arguments)._M_ptr = (pointer)0x0;
  (this->arguments)._M_extent._M_extent_value = 0;
  (this->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
  _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged = false;
  this->overrides = (Symbol *)0x0;
  this->needsMatchCheck = false;
  this->firstExternImpl = (ExternImpl *)0x0;
  return;
}

Assistant:

MethodPrototypeSymbol::MethodPrototypeSymbol(Compilation& compilation, std::string_view name,
                                             SourceLocation loc, SubroutineKind subroutineKind,
                                             Visibility visibility, bitmask<MethodFlags> flags) :
    Symbol(SymbolKind::MethodPrototype, name, loc), Scope(compilation, this),
    declaredReturnType(*this), subroutineKind(subroutineKind), visibility(visibility),
    flags(flags) {
}